

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void store_log(png_store *ps,png_const_structp pp,png_const_charp message,int is_error)

{
  int iVar1;
  char *prefix;
  int is_error_local;
  png_const_charp message_local;
  png_const_structp pp_local;
  png_store *ps_local;
  
  if (is_error == 0) {
    iVar1 = ps->nwarnings;
    ps->nwarnings = iVar1 + 1;
    if (iVar1 != 0) goto LAB_00106f37;
    iVar1 = ps->nerrors;
  }
  else {
    iVar1 = ps->nerrors;
    ps->nerrors = iVar1 + 1;
  }
  if (iVar1 == 0) {
    store_message(ps,pp,ps->error,0x100,0,message);
  }
LAB_00106f37:
  if ((ps->field_0x18 & 1) != 0) {
    prefix = "warning: ";
    if (is_error != 0) {
      prefix = "error: ";
    }
    store_verbose(ps,pp,prefix,message);
  }
  return;
}

Assistant:

static void
store_log(png_store* ps, png_const_structp pp, png_const_charp message,
   int is_error)
{
   /* The warning is copied to the error buffer if there are no errors and it is
    * the first warning.  The error is copied to the error buffer if it is the
    * first error (overwriting any prior warnings).
    */
   if (is_error ? (ps->nerrors)++ == 0 :
       (ps->nwarnings)++ == 0 && ps->nerrors == 0)
      store_message(ps, pp, ps->error, sizeof ps->error, 0, message);

   if (ps->verbose)
      store_verbose(ps, pp, is_error ? "error: " : "warning: ", message);
}